

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcatString.cpp
# Opt level: O0

void __thiscall
Js::LiteralStringWithPropertyStringPtr::GetPropertyRecordImpl
          (LiteralStringWithPropertyStringPtr *this,PropertyRecord **propRecord,
          bool dontLookupFromDictionary)

{
  PropertyRecord **ppPVar1;
  bool dontLookupFromDictionary_local;
  PropertyRecord **propRecord_local;
  LiteralStringWithPropertyStringPtr *this_local;
  
  ppPVar1 = Memory::WriteBarrierPtr::operator_cast_to_PropertyRecord__
                      ((WriteBarrierPtr *)&this->propertyRecord);
  if (*ppPVar1 == (PropertyRecord *)0x0) {
    JavascriptString::GetPropertyRecord
              ((JavascriptString *)this,propRecord,dontLookupFromDictionary);
    if (*propRecord != (PropertyRecord *)0x0) {
      CachePropertyRecordImpl(this,*propRecord);
    }
  }
  else {
    ppPVar1 = Memory::WriteBarrierPtr::operator_cast_to_PropertyRecord__
                        ((WriteBarrierPtr *)&this->propertyRecord);
    *propRecord = *ppPVar1;
  }
  return;
}

Assistant:

void LiteralStringWithPropertyStringPtr::GetPropertyRecordImpl(_Out_ PropertyRecord const** propRecord, bool dontLookupFromDictionary)
    {
        if (this->propertyRecord)
        {
            *propRecord = this->propertyRecord;
            return;
        }

        __super::GetPropertyRecord(propRecord, dontLookupFromDictionary);

        if (*propRecord)
        {
            CachePropertyRecordImpl(*propRecord);
        }
    }